

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O3

void anon_unknown.dwarf_1e376::reduceY
               (ChannelList *channels,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *doNotFilter,Extrapolation ext,bool odd,Image *image0,Image *image1)

{
  _Rb_tree_color _Var1;
  Image *pIVar2;
  Image *pIVar3;
  long lVar4;
  long lVar5;
  anon_unknown_dwarf_1e376 *paVar6;
  double dVar7;
  char cVar8;
  Extrapolation EVar9;
  ushort uVar10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  const_iterator cVar13;
  TypedImageChannel<float> *pTVar14;
  TypedImageChannel<float> *pTVar15;
  TypedImageChannel<Imath_3_2::half> *pTVar16;
  TypedImageChannel<Imath_3_2::half> *pTVar17;
  half *phVar18;
  TypedImageChannel<unsigned_int> *pTVar19;
  int iVar20;
  uint uVar21;
  undefined7 in_register_00000009;
  float fVar22;
  long lVar23;
  float *pfVar24;
  half *phVar25;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  uint *puVar31;
  int h;
  float *pfVar32;
  float fVar33;
  allocator<char> local_112;
  allocator<char> local_111;
  double local_110;
  double local_108;
  TypedImageChannel<float> *local_100;
  ulong local_f8;
  undefined4 local_f0;
  Extrapolation local_ec;
  double local_e8;
  key_type local_e0;
  double local_c0;
  double local_b8;
  long local_b0;
  ulong local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  string local_80;
  _Base_ptr local_60;
  Image *local_58;
  Image *local_50;
  _Rb_tree_node_base *local_48;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  ChannelList *local_38;
  
  local_f0 = (undefined4)CONCAT71(in_register_00000009,odd);
  local_ec = ext;
  local_58 = image1;
  local_50 = image0;
  local_40 = &doNotFilter->_M_t;
  p_Var11 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  local_38 = channels;
  p_Var12 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
  if (p_Var11 != p_Var12) {
    local_60 = &(((_Rep_type *)&local_40->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
    do {
      p_Var12 = p_Var11 + 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,(char *)p_Var12,(allocator<char> *)&local_80);
      cVar13 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(local_40,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      _Var1 = p_Var11[9]._M_color;
      local_48 = p_Var11;
      if (_Var1 == _S_red) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,(char *)p_Var12,&local_111);
        pTVar14 = (TypedImageChannel<float> *)Image::typedChannel<unsigned_int>(local_50,&local_e0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,(char *)p_Var12,&local_112);
        pTVar19 = Image::typedChannel<unsigned_int>(local_58,&local_80);
        pIVar2 = (pTVar19->super_ImageChannel)._image;
        uVar30 = ((pIVar2->_dataWindow).max.x - (pIVar2->_dataWindow).min.x) + 1;
        pIVar3 = (pTVar14->super_ImageChannel)._image;
        iVar26 = (pIVar3->_dataWindow).max.y - (pIVar3->_dataWindow).min.y;
        uVar27 = iVar26 + 1;
        local_f8 = (ulong)uVar27;
        iVar20 = (pIVar2->_dataWindow).max.y - (pIVar2->_dataWindow).min.y;
        uVar21 = iVar20 + 1;
        local_100 = pTVar14;
        if (cVar13._M_node == local_60) {
          if ((int)uVar21 < 2) {
            local_c0 = 1.0;
            if (uVar21 != 1) goto LAB_00109118;
          }
          else {
            local_c0 = (double)(iVar26 + -1) / (double)iVar20;
          }
          puVar31 = (pTVar19->_pixels)._data;
          local_e8 = (double)(ulong)uVar21;
          local_a8 = (ulong)uVar30;
          local_b8 = (double)((pTVar19->_pixels)._sizeY << 2);
          local_108 = 0.0;
          local_b0 = CONCAT44(local_b0._4_4_,uVar30);
          do {
            uVar28 = local_f8;
            if (0 < (int)uVar30) {
              local_88 = (double)local_108._0_4_ * local_c0;
              local_90 = local_88 + -1.0;
              local_98 = local_88 + 1.0;
              local_a0 = local_88 + 2.0;
              uVar29 = 0;
              do {
                EVar9 = local_ec;
                paVar6 = (anon_unknown_dwarf_1e376 *)(local_100->_pixels)._sizeY;
                pTVar19 = (TypedImageChannel<unsigned_int> *)(local_100->_pixels)._data;
                iVar20 = (int)uVar28;
                iVar26 = (int)uVar29;
                local_110 = sampleY<unsigned_int>(paVar6,pTVar19,iVar20,iVar26,local_90,local_ec);
                dVar7 = sampleY<unsigned_int>(paVar6,pTVar19,iVar20,iVar26,local_88,EVar9);
                local_110 = local_110 * 0.125 + dVar7 * 0.375;
                dVar7 = sampleY<unsigned_int>(paVar6,pTVar19,iVar20,iVar26,local_98,EVar9);
                local_110 = dVar7 * 0.375 + local_110;
                dVar7 = sampleY<unsigned_int>(paVar6,pTVar19,iVar20,iVar26,local_a0,EVar9);
                puVar31[uVar29] = (uint)(long)(dVar7 * 0.125 + local_110);
                uVar29 = uVar29 + 1;
              } while (local_a8 != uVar29);
            }
            local_108 = (double)((long)local_108 + 1);
            puVar31 = (uint *)((long)puVar31 + (long)local_b8);
            p_Var11 = local_48;
            uVar30 = (uint)local_b0;
          } while (local_108 != local_e8);
        }
        else if (0 < (int)uVar21) {
          lVar23 = (long)(int)(uVar27 + uVar21 * -2 + 1);
          lVar4 = (pTVar14->_pixels)._sizeY;
          lVar5 = (pTVar19->_pixels)._sizeY;
          puVar31 = (pTVar19->_pixels)._data;
          if ((char)local_f0 == '\0') {
            lVar23 = 0;
          }
          pfVar32 = (pTVar14->_pixels)._data + lVar23 * lVar4;
          uVar28 = 0;
          do {
            if (0 < (int)uVar30) {
              uVar29 = 0;
              do {
                puVar31[uVar29] = (uint)pfVar32[uVar29];
                uVar29 = uVar29 + 1;
              } while (uVar30 != uVar29);
            }
            uVar28 = uVar28 + 1;
            puVar31 = puVar31 + lVar5;
            pfVar32 = pfVar32 + lVar4 * 2;
          } while (uVar28 != uVar21);
        }
LAB_00109118:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        if (_Var1 == _S_black) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e0,(char *)p_Var12,&local_111);
          pTVar16 = Image::typedChannel<Imath_3_2::half>(local_50,&local_e0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,(char *)p_Var12,&local_112);
          pTVar17 = Image::typedChannel<Imath_3_2::half>(local_58,&local_80);
          pIVar2 = (pTVar17->super_ImageChannel)._image;
          uVar30 = ((pIVar2->_dataWindow).max.x - (pIVar2->_dataWindow).min.x) + 1;
          local_f8 = CONCAT44(local_f8._4_4_,uVar30);
          pIVar3 = (pTVar16->super_ImageChannel)._image;
          iVar26 = (pIVar3->_dataWindow).max.y - (pIVar3->_dataWindow).min.y;
          h = iVar26 + 1;
          iVar20 = (pIVar2->_dataWindow).max.y - (pIVar2->_dataWindow).min.y;
          uVar21 = iVar20 + 1;
          if (cVar13._M_node == local_60) {
            if ((int)uVar21 < 2) {
              local_e8 = 1.0;
              if (uVar21 != 1) goto LAB_00109118;
            }
            else {
              local_e8 = (double)(iVar26 + -1) / (double)iVar20;
            }
            local_100 = (TypedImageChannel<float> *)(pTVar17->_pixels)._data;
            local_b8 = (double)(ulong)uVar21;
            local_a8 = (ulong)uVar30;
            local_b0 = (pTVar17->_pixels)._sizeY * 2;
            local_108 = 0.0;
            do {
              if (0 < (int)uVar30) {
                local_88 = (double)local_108._0_4_ * local_e8;
                local_90 = local_88 + -1.0;
                local_98 = local_88 + 1.0;
                local_a0 = local_88 + 2.0;
                uVar28 = 0;
                do {
                  EVar9 = local_ec;
                  paVar6 = (anon_unknown_dwarf_1e376 *)(pTVar16->_pixels)._sizeY;
                  pTVar17 = (TypedImageChannel<Imath_3_2::half> *)(pTVar16->_pixels)._data;
                  iVar20 = (int)uVar28;
                  local_110 = sampleY<Imath_3_2::half>(paVar6,pTVar17,h,iVar20,local_90,local_ec);
                  dVar7 = sampleY<Imath_3_2::half>(paVar6,pTVar17,h,iVar20,local_88,EVar9);
                  local_110 = local_110 * 0.125 + dVar7 * 0.375;
                  dVar7 = sampleY<Imath_3_2::half>(paVar6,pTVar17,h,iVar20,local_98,EVar9);
                  local_110 = dVar7 * 0.375 + local_110;
                  dVar7 = sampleY<Imath_3_2::half>(paVar6,pTVar17,h,iVar20,local_a0,EVar9);
                  fVar33 = (float)(dVar7 * 0.125 + local_110);
                  fVar22 = ABS(fVar33);
                  uVar10 = (ushort)((uint)fVar33 >> 0x10) & 0x8000;
                  if ((uint)fVar22 < 0x38800000) {
                    if ((0x33000000 < (uint)fVar22) &&
                       (uVar30 = (uint)fVar22 & 0x7fffff | 0x800000,
                       cVar8 = (char)((uint)fVar22 >> 0x17),
                       uVar10 = uVar10 | (ushort)(uVar30 >> (0x7eU - cVar8 & 0x1f)),
                       0x80000000 < uVar30 << (cVar8 + 0xa2U & 0x1f))) {
                      uVar10 = uVar10 + 1;
                    }
                  }
                  else if ((uint)fVar22 < 0x7f800000) {
                    if ((uint)fVar22 < 0x477ff000) {
                      uVar10 = (ushort)((int)fVar22 + 0x8000fff +
                                        (uint)(((uint)fVar22 >> 0xd & 1) != 0) >> 0xd) | uVar10;
                    }
                    else {
                      uVar10 = uVar10 | 0x7c00;
                    }
                  }
                  else {
                    uVar10 = uVar10 | 0x7c00;
                    if (fVar22 != INFINITY) {
                      uVar30 = (uint)fVar22 >> 0xd & 0x3ff;
                      uVar10 = uVar10 | (ushort)uVar30 | (ushort)(uVar30 == 0);
                    }
                  }
                  *(ushort *)
                   ((long)&(local_100->super_ImageChannel)._vptr_ImageChannel + uVar28 * 2) = uVar10
                  ;
                  uVar28 = uVar28 + 1;
                } while (local_a8 != uVar28);
              }
              local_108 = (double)((long)local_108 + 1);
              local_100 = (TypedImageChannel<float> *)
                          ((long)&(local_100->super_ImageChannel)._vptr_ImageChannel + local_b0);
              p_Var11 = local_48;
              uVar30 = (uint)local_f8;
            } while (local_108 != local_b8);
          }
          else if (0 < (int)uVar21) {
            lVar23 = (long)(int)(h + uVar21 * -2 + 1);
            lVar4 = (pTVar16->_pixels)._sizeY;
            lVar5 = (pTVar17->_pixels)._sizeY;
            phVar18 = (pTVar17->_pixels)._data;
            if ((char)local_f0 == '\0') {
              lVar23 = 0;
            }
            phVar25 = (pTVar16->_pixels)._data + lVar23 * lVar4;
            uVar28 = 0;
            do {
              if (0 < (int)uVar30) {
                uVar29 = 0;
                do {
                  phVar18[uVar29]._h = phVar25[uVar29]._h;
                  uVar29 = uVar29 + 1;
                } while (uVar30 != uVar29);
              }
              uVar28 = uVar28 + 1;
              phVar18 = phVar18 + lVar5;
              phVar25 = phVar25 + lVar4 * 2;
            } while (uVar28 != uVar21);
          }
          goto LAB_00109118;
        }
        if (_Var1 == 2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e0,(char *)p_Var12,&local_111);
          pTVar14 = Image::typedChannel<float>(local_50,&local_e0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,(char *)p_Var12,&local_112);
          pTVar15 = Image::typedChannel<float>(local_58,&local_80);
          pIVar2 = (pTVar15->super_ImageChannel)._image;
          uVar30 = ((pIVar2->_dataWindow).max.x - (pIVar2->_dataWindow).min.x) + 1;
          pIVar3 = (pTVar14->super_ImageChannel)._image;
          iVar26 = (pIVar3->_dataWindow).max.y - (pIVar3->_dataWindow).min.y;
          uVar27 = iVar26 + 1;
          local_f8 = (ulong)uVar27;
          iVar20 = (pIVar2->_dataWindow).max.y - (pIVar2->_dataWindow).min.y;
          uVar21 = iVar20 + 1;
          local_100 = pTVar14;
          if (cVar13._M_node == local_60) {
            if ((int)uVar21 < 2) {
              local_c0 = 1.0;
              if (uVar21 != 1) goto LAB_00109118;
            }
            else {
              local_c0 = (double)(iVar26 + -1) / (double)iVar20;
            }
            pfVar32 = (pTVar15->_pixels)._data;
            local_e8 = (double)(ulong)uVar21;
            local_a8 = (ulong)uVar30;
            local_b8 = (double)((pTVar15->_pixels)._sizeY << 2);
            local_108 = 0.0;
            local_b0 = CONCAT44(local_b0._4_4_,uVar30);
            do {
              uVar28 = local_f8;
              if (0 < (int)uVar30) {
                local_88 = (double)local_108._0_4_ * local_c0;
                local_90 = local_88 + -1.0;
                local_98 = local_88 + 1.0;
                local_a0 = local_88 + 2.0;
                uVar29 = 0;
                do {
                  EVar9 = local_ec;
                  paVar6 = (anon_unknown_dwarf_1e376 *)(local_100->_pixels)._sizeY;
                  pTVar14 = (TypedImageChannel<float> *)(local_100->_pixels)._data;
                  iVar20 = (int)uVar28;
                  iVar26 = (int)uVar29;
                  local_110 = sampleY<float>(paVar6,pTVar14,iVar20,iVar26,local_90,local_ec);
                  dVar7 = sampleY<float>(paVar6,pTVar14,iVar20,iVar26,local_88,EVar9);
                  local_110 = local_110 * 0.125 + dVar7 * 0.375;
                  dVar7 = sampleY<float>(paVar6,pTVar14,iVar20,iVar26,local_98,EVar9);
                  local_110 = dVar7 * 0.375 + local_110;
                  dVar7 = sampleY<float>(paVar6,pTVar14,iVar20,iVar26,local_a0,EVar9);
                  pfVar32[uVar29] = (float)(dVar7 * 0.125 + local_110);
                  uVar29 = uVar29 + 1;
                } while (local_a8 != uVar29);
              }
              local_108 = (double)((long)local_108 + 1);
              pfVar32 = (float *)((long)pfVar32 + (long)local_b8);
              p_Var11 = local_48;
              uVar30 = (uint)local_b0;
            } while (local_108 != local_e8);
          }
          else if (0 < (int)uVar21) {
            lVar23 = (long)(int)(uVar27 + uVar21 * -2 + 1);
            lVar4 = (pTVar14->_pixels)._sizeY;
            lVar5 = (pTVar15->_pixels)._sizeY;
            pfVar32 = (pTVar15->_pixels)._data;
            if ((char)local_f0 == '\0') {
              lVar23 = 0;
            }
            pfVar24 = (pTVar14->_pixels)._data + lVar23 * lVar4;
            uVar28 = 0;
            do {
              if (0 < (int)uVar30) {
                uVar29 = 0;
                do {
                  pfVar32[uVar29] = pfVar24[uVar29];
                  uVar29 = uVar29 + 1;
                } while (uVar30 != uVar29);
              }
              uVar28 = uVar28 + 1;
              pfVar32 = pfVar32 + lVar5;
              pfVar24 = pfVar24 + lVar4 * 2;
            } while (uVar28 != uVar21);
          }
          goto LAB_00109118;
        }
      }
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      p_Var12 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    } while (p_Var11 != p_Var12);
  }
  return;
}

Assistant:

void
reduceY (
    const ChannelList& channels,
    const set<string>& doNotFilter,
    Extrapolation      ext,
    bool               odd,
    const Image&       image0,
    Image&             image1)
{
    //
    // Shrink image image0 vertically by a factor of 2,
    // and store the result in image image1.
    //

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        const char*    name    = i.name ();
        const Channel& channel = i.channel ();
        bool           filter = (doNotFilter.find (name) == doNotFilter.end ());

        switch (channel.type)
        {
            case IMF::HALF:

                reduceY (
                    image0.typedChannel<half> (name),
                    image1.typedChannel<half> (name),
                    filter,
                    ext,
                    odd);
                break;

            case IMF::FLOAT:

                reduceY (
                    image0.typedChannel<float> (name),
                    image1.typedChannel<float> (name),
                    filter,
                    ext,
                    odd);
                break;

            case IMF::UINT:

                reduceY (
                    image0.typedChannel<unsigned int> (name),
                    image1.typedChannel<unsigned int> (name),
                    filter,
                    ext,
                    odd);
                break;
            default: break;
        }
    }
}